

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O0

int Wln_ObjRangeBeg(Wln_Ntk_t *p,int i)

{
  Hash_IntMan_t *p_00;
  int iVar1;
  int i_local;
  Wln_Ntk_t *p_local;
  
  p_00 = p->pRanges;
  iVar1 = Wln_ObjRangeId(p,i);
  iVar1 = Hash_IntObjData1(p_00,iVar1);
  return iVar1;
}

Assistant:

static inline int          Wln_ObjRangeBeg( Wln_Ntk_t * p, int i )               { return Hash_IntObjData1( p->pRanges, Wln_ObjRangeId(p, i) );               }